

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O1

DdNode * cuddBddXorExistAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  DdHalfWord *pDVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  uint *puVar10;
  DdNode *cube_00;
  DdNode *pDVar11;
  DdHalfWord *pDVar12;
  DdNode *pDVar13;
  DdNode *pDVar14;
  uint *puVar15;
  DdNode *g_00;
  uint index;
  DdNode *pDVar16;
  
  do {
    pDVar11 = manager->one;
    pDVar8 = (DdNode *)((ulong)pDVar11 ^ 1);
    if (f == g) {
      return pDVar8;
    }
    if ((DdNode *)((ulong)g ^ 1) == f) {
      return pDVar11;
    }
    if (pDVar11 == cube) {
      pDVar11 = cuddBddXorRecur(manager,f,g);
      return pDVar11;
    }
    pDVar16 = (DdNode *)((ulong)g ^ 1);
    if (pDVar11 == f) {
LAB_007c0968:
      pDVar11 = cuddBddExistAbstractRecur(manager,pDVar16,cube);
      return pDVar11;
    }
    if (pDVar11 == g) {
      pDVar16 = (DdNode *)((ulong)f ^ 1);
      goto LAB_007c0968;
    }
    pDVar16 = g;
    if ((pDVar8 == f) || (pDVar16 = f, pDVar8 == g)) goto LAB_007c0968;
    pDVar8 = f;
    pDVar16 = g;
    if ((long)((ulong)((uint)f & 1) + *(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2) <=
        (long)((ulong)((uint)g & 1) + *(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2)) {
      pDVar8 = g;
      pDVar16 = f;
    }
    pDVar9 = cuddCacheLookup(manager,10,pDVar16,pDVar8,cube);
    if (pDVar9 != (DdNode *)0x0) {
      return pDVar9;
    }
    puVar15 = (uint *)((ulong)pDVar16 & 0xfffffffffffffffe);
    piVar6 = manager->perm;
    uVar2 = *puVar15;
    uVar3 = piVar6[uVar2];
    puVar10 = (uint *)((ulong)pDVar8 & 0xfffffffffffffffe);
    uVar4 = piVar6[*puVar10];
    uVar7 = uVar3;
    if (uVar4 < uVar3) {
      uVar7 = uVar4;
    }
    uVar5 = piVar6[cube->index];
    if (uVar7 <= uVar5) {
      pDVar9 = pDVar16;
      pDVar14 = pDVar16;
      index = *puVar10;
      if (uVar3 <= uVar4) {
        pDVar9 = *(DdNode **)(puVar15 + 4);
        pDVar14 = *(DdNode **)(puVar15 + 6);
        index = uVar2;
        if (((ulong)pDVar16 & 1) != 0) {
          pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
          pDVar14 = (DdNode *)((ulong)pDVar14 ^ 1);
        }
      }
      pDVar13 = pDVar8;
      g_00 = pDVar8;
      if (uVar4 <= uVar3) {
        pDVar13 = *(DdNode **)(puVar10 + 4);
        g_00 = *(DdNode **)(puVar10 + 6);
        if (((ulong)pDVar8 & 1) != 0) {
          pDVar13 = (DdNode *)((ulong)pDVar13 ^ 1);
          g_00 = (DdNode *)((ulong)g_00 ^ 1);
        }
      }
      cube_00 = cube;
      if (uVar5 == uVar7) {
        cube_00 = (cube->type).kids.T;
      }
      pDVar9 = cuddBddXorExistAbstractRecur(manager,pDVar9,pDVar13,cube_00);
      if (pDVar9 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      if ((uVar5 == uVar7) && (pDVar9 == pDVar11)) {
        cuddCacheInsert(manager,10,pDVar16,pDVar8,cube,pDVar11);
        return pDVar11;
      }
      pDVar13 = (DdNode *)((ulong)pDVar9 & 0xfffffffffffffffe);
      pDVar13->ref = pDVar13->ref + 1;
      pDVar11 = cuddBddXorExistAbstractRecur(manager,pDVar14,g_00,cube_00);
      if (pDVar11 == (DdNode *)0x0) goto LAB_007c0b85;
      piVar6 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
      *piVar6 = *piVar6 + 1;
      if (uVar5 == uVar7) {
        pDVar14 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar9 ^ 1),
                                  (DdNode *)((ulong)pDVar11 ^ 1));
        if (pDVar14 != (DdNode *)0x0) {
          pDVar13 = (DdNode *)((ulong)pDVar14 ^ 1);
          piVar6 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
          *piVar6 = *piVar6 + 1;
          pDVar12 = (DdHalfWord *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
          Cudd_IterDerefBdd(manager,pDVar9);
          Cudd_IterDerefBdd(manager,pDVar11);
          goto LAB_007c0b4d;
        }
        goto LAB_007c0b74;
      }
      pDVar1 = &pDVar13->ref;
      pDVar12 = (DdHalfWord *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
      if (pDVar9 == pDVar11) {
        *pDVar1 = *pDVar1 - 1;
        pDVar13 = pDVar9;
        goto LAB_007c0b4d;
      }
      if (((ulong)pDVar9 & 1) == 0) {
        pDVar13 = cuddUniqueInter(manager,index,pDVar9,pDVar11);
        if (pDVar13 != (DdNode *)0x0) {
LAB_007c0b43:
          *pDVar12 = *pDVar12 - 1;
          pDVar12 = pDVar1;
LAB_007c0b4d:
          *pDVar12 = *pDVar12 - 1;
          cuddCacheInsert(manager,10,pDVar16,pDVar8,cube,pDVar13);
          return pDVar13;
        }
      }
      else {
        pDVar13 = cuddUniqueInter(manager,index,pDVar13,(DdNode *)((ulong)pDVar11 ^ 1));
        if (pDVar13 != (DdNode *)0x0) {
          pDVar13 = (DdNode *)((ulong)pDVar13 ^ 1);
          goto LAB_007c0b43;
        }
      }
LAB_007c0b74:
      Cudd_IterDerefBdd(manager,pDVar9);
      pDVar9 = pDVar11;
LAB_007c0b85:
      Cudd_IterDerefBdd(manager,pDVar9);
      return (DdNode *)0x0;
    }
    cube = (cube->type).kids.T;
    g = pDVar8;
    f = pDVar16;
  } while( true );
}

Assistant:

DdNode *
cuddBddXorExistAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *zero, *r, *t, *e, *Cube;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == g) {
        return(zero);
    }
    if (f == Cudd_Not(g)) {
        return(one);
    }
    if (cube == one) {
        return(cuddBddXorRecur(manager, f, g));
    }
    if (f == one) {
        return(cuddBddExistAbstractRecur(manager, Cudd_Not(g), cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, Cudd_Not(f), cube));
    }
    if (f == zero) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == zero) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }

    /* At this point f, g, and cube are not constant. */

    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Check cache. */
    r = cuddCacheLookup(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube);
    if (r != NULL) {
        return(r);
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    topf = manager->perm[F->index];
    G = Cudd_Regular(g);
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    if (topcube < top) {
        return(cuddBddXorExistAbstractRecur(manager, f, g, cuddT(cube)));
    }
    /* Now, topcube >= top. */

    if (topf == top) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg == top) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    if (topcube == top) {
        Cube = cuddT(cube);
    } else {
        Cube = cube;
    }

    t = cuddBddXorExistAbstractRecur(manager, fv, gv, Cube);
    if (t == NULL) return(NULL);

    /* Special case: 1 OR anything = 1. Hence, no need to compute
    ** the else branch if t is 1.
    */
    if (t == one && topcube == top) {
        cuddCacheInsert(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube, one);
        return(one);
    }
    cuddRef(t);

    e = cuddBddXorExistAbstractRecur(manager, fnv, gnv, Cube);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (topcube == top) {       /* abstract */
        r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
        if (r == NULL) {
            Cudd_IterDerefBdd(manager, t);
            Cudd_IterDerefBdd(manager, e);
            return(NULL);
        }
        r = Cudd_Not(r);
        cuddRef(r);
        Cudd_IterDerefBdd(manager, t);
        Cudd_IterDerefBdd(manager, e);
        cuddDeref(r);
    } else if (t == e) {
        r = t;
        cuddDeref(t);
        cuddDeref(e);
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
        cuddDeref(e);
        cuddDeref(t);
    }
    cuddCacheInsert(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}